

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O0

Ref trun::TestRunner::GetCurrentTestModule(void)

{
  shared_ptr<trun::TestModule> *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ref RVar2;
  
  psVar1 = (shared_ptr<trun::TestModule> *)_ZTWL13threadContext();
  std::shared_ptr<trun::TestModule>::shared_ptr((shared_ptr<trun::TestModule> *)in_RDI,psVar1);
  RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestModule::Ref TestRunner::GetCurrentTestModule() {
    return threadContext.currentTestModule;
}